

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

int Dau_DecPerform(word *pInit,int nVars,uint uSet)

{
  int iVar1;
  int iVar2;
  int *pSched_00;
  uint local_88b4;
  int nWords;
  int ResD;
  int ResC;
  int status;
  int i;
  int v;
  int *pSched;
  int pPermD [16];
  int pPermC [16];
  int P2V [16];
  int V2P [16];
  int local_875c;
  int local_8758;
  int nVarsD;
  int nVarsC;
  int nVarsF;
  int nVarsS;
  int nVarsU;
  char pDsdD [5000];
  char local_73b8 [8];
  char pDsdC [5000];
  word local_6028;
  word pComp [1024];
  word pDec [1024];
  word p [1024];
  uint uSet_local;
  int nVars_local;
  word *pInit_local;
  
  local_8758 = 0;
  local_875c = 0;
  iVar1 = Abc_TtWordNum(nVars);
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x30b,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  memcpy(pDec + 0x3ff,pInit,(long)iVar1 << 3);
  Dau_DecSortSet(uSet,nVars,&nVarsF,&nVarsC,&nVarsD);
  for (status = 0; status < nVars; status = status + 1) {
    pPermC[(long)status + 0xe] = status;
    P2V[(long)status + 0xe] = status;
  }
  ResC = 0;
  for (status = 0; status < nVars; status = status + 1) {
    if ((uSet >> ((byte)(status << 1) & 0x1f) & 3) == 0) {
      Abc_TtMoveVar(pDec + 0x3ff,nVars,P2V + 0xe,pPermC + 0xe,status,ResC);
      pPermD[(long)local_8758 + 0xe] = status;
      ResC = ResC + 1;
      local_8758 = local_8758 + 1;
    }
  }
  for (status = 0; status < nVars; status = status + 1) {
    if ((uSet >> ((byte)(status << 1) & 0x1f) & 3) == 3) {
      Abc_TtMoveVar(pDec + 0x3ff,nVars,P2V + 0xe,pPermC + 0xe,status,ResC);
      pPermD[(long)local_8758 + 0xe] = status;
      ResC = ResC + 1;
      local_8758 = local_8758 + 1;
    }
  }
  iVar1 = local_8758 + 1;
  pPermD[(long)local_8758 + 0xe] = nVars;
  for (status = 0; status < nVars; status = status + 1) {
    if ((uSet >> ((byte)(status << 1) & 0x1f) & 3) == 1) {
      Abc_TtMoveVar(pDec + 0x3ff,nVars,P2V + 0xe,pPermC + 0xe,status,ResC);
      pPermD[(long)local_875c + -2] = status;
      ResC = ResC + 1;
      local_875c = local_875c + 1;
    }
  }
  for (status = 0; status < nVarsC; status = status + 1) {
    pPermD[(long)local_875c + -2] = pPermD[(long)(nVarsD + status) + 0xe];
    local_875c = local_875c + 1;
  }
  if (local_875c != nVarsF + nVarsC) {
    __assert_fail("nVarsD == nVarsU + nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,799,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  if (iVar1 != nVarsD + nVarsC + 1) {
    __assert_fail("nVarsC == nVarsF + nVarsS + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,800,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  if (ResC != nVars) {
    __assert_fail("i == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x321,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  pSched_00 = Extra_GreyCodeSchedule(nVarsF + nVarsC);
  iVar2 = Abc_TtWordNum(local_875c);
  memset(pComp + 0x3ff,0,(long)iVar2 << 3);
  iVar2 = Abc_TtWordNum(iVar1);
  memset(&local_6028,0,(long)iVar2 << 3);
  if (nVarsC == 0) {
    local_88b4 = 0;
  }
  else {
    local_88b4 = Abc_InfoMask(nVarsC);
  }
  iVar2 = Dau_DecCheckSetTop(pDec + 0x3ff,nVars,nVarsD,nVarsF + nVarsC,nVarsC,local_88b4,pSched_00,
                             pComp + 0x3ff,&local_6028);
  if (pSched_00 != (int *)0x0) {
    free(pSched_00);
  }
  if (iVar2 != 0) {
    Dau_DsdDecompose(&local_6028,iVar1,0,1,local_73b8);
    Dau_DsdDecompose(pComp + 0x3ff,local_875c,0,1,(char *)&nVarsS);
    Dau_DecVarReplace((char *)&nVarsS,(int *)&pSched,local_875c);
    Dau_DecVarReplace(local_73b8,pPermD + 0xe,iVar1);
    printf("     ");
    printf("%3d : ",0);
    printf("%24s  ",&nVarsS);
    printf("%24s  ",local_73b8);
    Dau_DecVerify(pInit,nVars,local_73b8,(char *)&nVarsS);
  }
  else {
    printf("  Decomposition does not exist\n");
  }
  pInit_local._4_4_ = (uint)(iVar2 != 0);
  return pInit_local._4_4_;
}

Assistant:

int Dau_DecPerform( word * pInit, int nVars, unsigned uSet )
{
    word p[1<<10], pDec[1<<10], pComp[1<<10]; // at most 2^10 words
    char pDsdC[5000], pDsdD[5000];  // at most 2^12 hex digits
    int nVarsU, nVarsS, nVarsF, nVarsC = 0, nVarsD = 0;
    int V2P[16], P2V[16], pPermC[16], pPermD[16], * pSched;
    int v, i, status, ResC, ResD;
    int nWords = Abc_TtWordNum(nVars);
    assert( nVars <= 16 );
    // backup the function
    memcpy( p, pInit, sizeof(word) * nWords );
    // get variable numbers
    Dau_DecSortSet( uSet, nVars, &nVarsU, &nVarsS, &nVarsF );
    // permute function and order variables
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    for ( i = v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 0 ) // free first
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermC[nVarsC++] = v;
    for ( v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 3 ) // share second
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermC[nVarsC++] = v;
    pPermC[nVarsC++] = nVars;
    for ( v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 1 ) // unique last
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermD[nVarsD++] = v;
    for ( v = 0; v < nVarsS; v++ )
        pPermD[nVarsD++] = pPermC[nVarsF+v];
    assert( nVarsD == nVarsU + nVarsS );
    assert( nVarsC == nVarsF + nVarsS + 1 );
    assert( i == nVars );
    // decompose
    pSched = Extra_GreyCodeSchedule( nVarsU + nVarsS );
    memset( pDec, 0, sizeof(word) * Abc_TtWordNum(nVarsD) );
    memset( pComp, 0, sizeof(word) * Abc_TtWordNum(nVarsC) );
    status = Dau_DecCheckSetTop( p, nVars, nVarsF, nVarsU + nVarsS, nVarsS, nVarsS ? Abc_InfoMask(nVarsS) : 0, pSched, pDec, pComp );
    ABC_FREE( pSched );
    if ( !status )
    {
        printf( "  Decomposition does not exist\n" );
        return 0;
    }
//    Dau_DsdPrintFromTruth( stdout, pC, nVars+1 ); //printf( "\n" );
//    Dau_DsdPrintFromTruth( stdout, pD, nVars ); //printf( "\n" );
//    Kit_DsdPrintFromTruth( (unsigned *)pComp, 6 ); printf( "\n" );
//    Kit_DsdPrintFromTruth( (unsigned *)pDec, 6 );  printf( "\n" );
    // decompose
    ResC = Dau_DsdDecompose( pComp, nVarsC, 0, 1, pDsdC );
    ResD = Dau_DsdDecompose( pDec, nVarsD, 0, 1, pDsdD );
    // replace variables
    Dau_DecVarReplace( pDsdD, pPermD, nVarsD );
    Dau_DecVarReplace( pDsdC, pPermC, nVarsC );
    // report
    printf( "     " );
    printf( "%3d : ", 0 );
    printf( "%24s  ", pDsdD );
    printf( "%24s  ", pDsdC );
    Dau_DecVerify( pInit, nVars, pDsdC, pDsdD );
    return 1;
}